

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async_log_helper.h
# Opt level: O0

void __thiscall
spdlog::details::async_log_helper::async_log_helper
          (async_log_helper *this,formatter_ptr *formatter,
          vector<std::shared_ptr<spdlog::sinks::sink>,_std::allocator<std::shared_ptr<spdlog::sinks::sink>_>_>
          *sinks,size_t queue_size,log_err_handler *err_handler,
          async_overflow_policy overflow_policy,function<void_()> *worker_warmup_cb,
          milliseconds *flush_interval_ms,function<void_()> *worker_teardown_cb)

{
  async_log_helper *local_68;
  code *local_60;
  undefined8 local_58;
  thread local_50 [3];
  async_overflow_policy local_34;
  log_err_handler *plStack_30;
  async_overflow_policy overflow_policy_local;
  log_err_handler *err_handler_local;
  size_t queue_size_local;
  vector<std::shared_ptr<spdlog::sinks::sink>,_std::allocator<std::shared_ptr<spdlog::sinks::sink>_>_>
  *sinks_local;
  formatter_ptr *formatter_local;
  async_log_helper *this_local;
  
  local_34 = overflow_policy;
  plStack_30 = err_handler;
  err_handler_local = (log_err_handler *)queue_size;
  queue_size_local = (size_t)sinks;
  sinks_local = (vector<std::shared_ptr<spdlog::sinks::sink>,_std::allocator<std::shared_ptr<spdlog::sinks::sink>_>_>
                 *)formatter;
  formatter_local = &this->_formatter;
  std::shared_ptr<spdlog::formatter>::shared_ptr(&this->_formatter,formatter);
  std::
  vector<std::shared_ptr<spdlog::sinks::sink>,_std::allocator<std::shared_ptr<spdlog::sinks::sink>_>_>
  ::vector(&this->_sinks,sinks);
  mpmc_bounded_queue<spdlog::details::async_log_helper::async_msg>::mpmc_bounded_queue
            (&this->_q,(size_t)err_handler_local);
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::function(&this->_err_handler,err_handler);
  this->_flush_requested = false;
  this->_terminate_requested = false;
  this->_overflow_policy = local_34;
  std::function<void_()>::function(&this->_worker_warmup_cb,worker_warmup_cb);
  (this->_flush_interval_ms).__r = flush_interval_ms->__r;
  std::function<void_()>::function(&this->_worker_teardown_cb,worker_teardown_cb);
  std::thread::thread(&this->_worker_thread);
  local_60 = worker_loop;
  local_58 = 0;
  local_68 = this;
  std::thread::
  thread<void(spdlog::details::async_log_helper::*)(),spdlog::details::async_log_helper*,void>
            (local_50,(type *)&local_60,&local_68);
  std::thread::operator=(&this->_worker_thread,local_50);
  std::thread::~thread(local_50);
  return;
}

Assistant:

inline spdlog::details::async_log_helper::async_log_helper(formatter_ptr formatter, std::vector<sink_ptr> sinks, size_t queue_size,
    log_err_handler err_handler, const async_overflow_policy overflow_policy, std::function<void()> worker_warmup_cb,
    const std::chrono::milliseconds &flush_interval_ms, std::function<void()> worker_teardown_cb)
    : _formatter(std::move(formatter))
    , _sinks(std::move(sinks))
    , _q(queue_size)
    , _err_handler(std::move(err_handler))
    , _flush_requested(false)
    , _terminate_requested(false)
    , _overflow_policy(overflow_policy)
    , _worker_warmup_cb(std::move(worker_warmup_cb))
    , _flush_interval_ms(flush_interval_ms)
    , _worker_teardown_cb(std::move(worker_teardown_cb))
{
    _worker_thread = std::thread(&async_log_helper::worker_loop, this);
}